

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::insert_simplex_and_subfaces<int[2]>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,int (*Nsimplex) [2],
          Filtration_value *filtration)

{
  long lVar1;
  int *piVar2;
  Filtration_value *filt;
  int iVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  undefined8 *puVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  const_iterator __position;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar7;
  
  if ((char)in_FS_OFFSET[-0x19] == '\0') {
    in_FS_OFFSET[-0x1a] = 0;
    in_FS_OFFSET[-0x1c] = 0;
    in_FS_OFFSET[-0x1b] = 0;
    __cxa_thread_atexit(std::vector<int,_std::allocator<int>_>::~vector,*in_FS_OFFSET + -0xe0,
                        &__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x19) = 1;
  }
  lVar1 = *in_FS_OFFSET;
  piVar2 = (int *)in_FS_OFFSET[-0x1c];
  __position._M_current = (int *)in_FS_OFFSET[-0x1b];
  if ((int *)in_FS_OFFSET[-0x1b] != piVar2) {
    in_FS_OFFSET[-0x1b] = (long)piVar2;
    __position._M_current = piVar2;
  }
  std::vector<int,std::allocator<int>>::insert<int_const*,void>
            ((vector<int,std::allocator<int>> *)(lVar1 + -0xe0),__position,(int *)filtration,
             (int *)(filtration + 1));
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (in_FS_OFFSET[-0x1c],in_FS_OFFSET[-0x1b]);
  _Var4 = std::
          __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (in_FS_OFFSET[-0x1c],in_FS_OFFSET[-0x1b]);
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)(lVar1 + -0xe0),(const_iterator)_Var4._M_current,
             (int *)in_FS_OFFSET[-0x1b]);
  _Var4._M_current = (int *)in_FS_OFFSET[-0x1c];
  filt = (Filtration_value *)in_FS_OFFSET[-0x1b];
  _Var6._M_current = _Var4._M_current;
  do {
    if ((Filtration_value *)_Var6._M_current == filt) {
      iVar3 = (int)((ulong)((long)filt - (long)_Var4._M_current) >> 2) + -1;
      if (iVar3 < Nsimplex[0x10][0]) {
        iVar3 = Nsimplex[0x10][0];
      }
      Nsimplex[0x10][0] = iVar3;
      pVar7 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                        (this,(Siblings *)Nsimplex,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (Nsimplex + 8),_Var4,filt);
      pVar7.first.m_ptr =
           (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
            *)this;
      return pVar7;
    }
    iVar3 = *_Var6._M_current;
    _Var6._M_current = (int *)((long)_Var6._M_current + 4);
  } while (iVar3 != Nsimplex[7][0]);
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "cannot use the dummy null_vertex() as a real vertex";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }